

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::end_query(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GLuint id;
  GLuint local_34;
  string local_30;
  
  local_34 = 0;
  glu::CallLogWrapper::glGenQueries(&ctx->super_CallLogWrapper,1,&local_34);
  paVar1 = &local_30.field_2;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,
             "GL_INVALID_ENUM is generated if target is not one of the accepted tokens.","");
  NegativeTestContext::beginSection(ctx,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glEndQuery(&ctx->super_CallLogWrapper,0xffffffff);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,
             "GL_INVALID_OPERATION is generated if ctx.glEndQuery is executed when a query object of the same target is not active."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glEndQuery(&ctx->super_CallLogWrapper,0x8c2f);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBeginQuery(&ctx->super_CallLogWrapper,0x8c2f,local_34);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glEndQuery(&ctx->super_CallLogWrapper,0x8c88);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glEndQuery(&ctx->super_CallLogWrapper,0x8c2f);
  NegativeTestContext::expectError(ctx,0);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteQueries(&ctx->super_CallLogWrapper,1,&local_34);
  NegativeTestContext::expectError(ctx,0);
  return;
}

Assistant:

void end_query (NegativeTestContext& ctx)
{
	GLuint id = 0;
	ctx.glGenQueries	(1, &id);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not one of the accepted tokens.");
	ctx.glEndQuery		(-1);
	ctx.expectError		(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if ctx.glEndQuery is executed when a query object of the same target is not active.");
	ctx.glEndQuery		(GL_ANY_SAMPLES_PASSED);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED, id);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glEndQuery		(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glEndQuery		(GL_ANY_SAMPLES_PASSED);
	ctx.expectError		(GL_NO_ERROR);
	ctx.endSection();

	ctx.glDeleteQueries	(1, &id);
	ctx.expectError		(GL_NO_ERROR);
}